

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_texm3x3(Context *ctx,char *opcode,int dims)

{
  RegisterList *item;
  RegisterList *pRVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  if (ctx->minor_ver != 0xff) {
    uVar2 = (uint)ctx->minor_ver;
  }
  if (0x10003 < (uVar2 | (uint)ctx->major_ver << 0x10)) {
    failf(ctx,"%s opcode not available after Shader Model 1.3",opcode);
  }
  if (ctx->texm3x3pad_dst1 == -1) {
    failf(ctx,"%s opcode without matching TEXM3X3PADs",opcode);
  }
  state_texops(ctx,opcode,dims,0);
  ctx->reset_texmpad = 1;
  pRVar1 = (ctx->samplers).next;
  if (pRVar1 != (RegisterList *)0x0) {
    uVar2 = (ctx->dest_arg).regnum | 0xa0000;
    while (uVar3 = pRVar1->regtype << 0x10 | pRVar1->regnum, uVar2 != uVar3) {
      if ((uVar2 < uVar3) || (pRVar1 = pRVar1->next, pRVar1 == (RegisterList *)0x0))
      goto LAB_0011f351;
    }
    if (0xfffffffd < pRVar1->index - 5) {
      return;
    }
  }
LAB_0011f351:
  failf(ctx,"%s needs a 3D or Cubemap sampler",opcode);
  return;
}

Assistant:

static void state_texm3x3(Context *ctx, const char *opcode, const int dims)
{
    // !!! FIXME: check for correct opcode existance and order more rigorously?
    if (shader_version_atleast(ctx, 1, 4))
        failf(ctx, "%s opcode not available after Shader Model 1.3", opcode);
    if (ctx->texm3x3pad_dst1 == -1)
        failf(ctx, "%s opcode without matching TEXM3X3PADs", opcode);
    state_texops(ctx, opcode, dims, 0);
    ctx->reset_texmpad = 1;

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                      ctx->dest_arg.regnum);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);

    // A samplermap might change this to something nonsensical.
    if ((ttype != TEXTURE_TYPE_VOLUME) && (ttype != TEXTURE_TYPE_CUBE))
        failf(ctx, "%s needs a 3D or Cubemap sampler", opcode);
}